

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O3

void __thiscall Market::match(Market *this,Order *bid,Order *ask)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = bid->m_openQuantity;
  lVar2 = ask->m_openQuantity;
  if (lVar3 < ask->m_openQuantity) {
    lVar2 = lVar3;
  }
  dVar1 = ask->m_price;
  lVar4 = bid->m_executedQuantity + lVar2;
  bid->m_avgExecutedPrice =
       ((double)bid->m_executedQuantity * bid->m_avgExecutedPrice + (double)lVar2 * dVar1) /
       (double)lVar4;
  bid->m_openQuantity = lVar3 - lVar2;
  bid->m_executedQuantity = lVar4;
  bid->m_lastExecutedPrice = dVar1;
  bid->m_lastExecutedQuantity = lVar2;
  lVar3 = ask->m_executedQuantity + lVar2;
  ask->m_avgExecutedPrice =
       ((double)ask->m_executedQuantity * ask->m_avgExecutedPrice + (double)lVar2 * dVar1) /
       (double)lVar3;
  ask->m_openQuantity = ask->m_openQuantity - lVar2;
  ask->m_executedQuantity = lVar3;
  ask->m_lastExecutedPrice = dVar1;
  ask->m_lastExecutedQuantity = lVar2;
  return;
}

Assistant:

long getOpenQuantity() const { return m_openQuantity; }